

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatConstantTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatConstantTexture *this)

{
  float *in_RCX;
  
  StringPrintf<float_const&>
            (__return_storage_ptr__,(pbrt *)"[ FloatConstantTexture value: %f ]",(char *)this,in_RCX
            );
  return __return_storage_ptr__;
}

Assistant:

std::string FloatConstantTexture::ToString() const {
    return StringPrintf("[ FloatConstantTexture value: %f ]", value);
}